

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.h
# Opt level: O0

void __thiscall QTable::QTable(QTable *this,QTable *a)

{
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RSI;
  QTableInterface *in_RDI;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffe8;
  
  QTableInterface::QTableInterface(in_RDI);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(in_RSI,in_stack_ffffffffffffffe8);
  in_RDI->_vptr_QTableInterface = (_func_int **)&PTR_Get_00d33630;
  return;
}

Assistant:

QTable(const QTable& a)
        :   matrix_t(a)
        {}